

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceManager::selectedPostCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  bool bVar1;
  SnapshotManager *this_00;
  long in_RDI;
  Mat3x3d rbTau_1;
  Mat3x3d rbTau;
  Snapshot *curSnapshot;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  MoleculeIterator mi;
  ForceModifier **forceModifier;
  iterator __end1;
  iterator __begin1;
  vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *__range1;
  RigidBody *in_stack_00000358;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffee8;
  Snapshot *in_stack_fffffffffffffef0;
  pointer in_stack_ffffffffffffff08;
  Molecule *in_stack_ffffffffffffff10;
  RigidBody *local_50;
  reference local_38;
  iterator local_30;
  iterator local_28;
  pointer local_20;
  
  local_20 = (pointer)(in_RDI + 0x208);
  local_28 = std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::begin
                       ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *
                        )in_stack_fffffffffffffee8);
  local_30 = std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::end
                       ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *
                        )in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
               ::operator*(&stack0xffffffffffffffd8);
    (*(*local_38)->_vptr_ForceModifier[2])();
    __gnu_cxx::
    __normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
    ::operator++(&stack0xffffffffffffffd8);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
             &stack0xffffffffffffffc0);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
                       *)&stack0xffffffffffffffb8);
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
  SnapshotManager::getCurrentSnapshot(this_00);
  local_50 = Molecule::beginRigidBody
                       (in_stack_ffffffffffffff10,(iterator *)in_stack_ffffffffffffff08);
  while (local_50 != (RigidBody *)0x0) {
    RigidBody::calcForcesAndTorquesAndVirial(in_stack_00000358);
    RectMatrix<double,_3U,_3U>::operator+=
              ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3183ad);
    local_50 = Molecule::nextRigidBody
                         (in_stack_ffffffffffffff10,(iterator *)in_stack_ffffffffffffff08);
  }
  local_50 = Molecule::beginRigidBody
                       (in_stack_ffffffffffffff10,(iterator *)in_stack_ffffffffffffff08);
  while (local_50 != (RigidBody *)0x0) {
    in_stack_fffffffffffffef0 = (Snapshot *)&stack0xffffffffffffff08;
    RigidBody::calcForcesAndTorquesAndVirial(in_stack_00000358);
    RectMatrix<double,_3U,_3U>::operator+=
              ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x31844a);
    local_50 = Molecule::nextRigidBody
                         (in_stack_ffffffffffffff10,(iterator *)in_stack_ffffffffffffff08);
  }
  Snapshot::setVirialTensor(in_stack_fffffffffffffef0,(Mat3x3d *)in_stack_fffffffffffffee8);
  return;
}

Assistant:

void ForceManager::selectedPostCalculation(Molecule* mol1, Molecule* mol2) {
    for (auto& forceModifier : forceModifiers_)
      forceModifier->modifyForces();

    // Modify the rigid bodies in response to the applied force
    // modifications
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // Collect the atomic forces onto rigid bodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, virialTensor.getArrayPointer(), 9, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif
    curSnapshot->setVirialTensor(virialTensor);

    /*
      if (info_->getSimParams()->getUseLongRangeCorrections()) {

        RealType vol = curSnapshot->getVolume();
        RealType Elrc(0.0);
        RealType Wlrc(0.0);

        AtomTypeSet::iterator i;
        AtomTypeSet::iterator j;

        RealType n_i, n_j;
        RealType rho_i, rho_j;
        pair<RealType, RealType> LRI;

        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
        n_i = RealType(info_->getGlobalCountOfType(*i));
        rho_i = n_i /  vol;
        for (j = atomTypes_.begin(); j != atomTypes_.end(); ++j) {
        n_j = RealType(info_->getGlobalCountOfType(*j));
        rho_j = n_j / vol;

        LRI = interactionMan_->getLongRangeIntegrals( (*i), (*j) );

        Elrc += n_i   * rho_j * LRI.first;
        Wlrc -= rho_i * rho_j * LRI.second;
        }
        }
        Elrc *= 2.0 * Constants::PI;
        Wlrc *= 2.0 * Constants::PI;

        RealType lrp = curSnapshot->getLongRangePotential();
        curSnapshot->setLongRangePotential(lrp + Elrc);
        virialTensor += Wlrc * SquareMatrix3<RealType>::identity();
        curSnapshot->setVirialTensor(virialTensor);
      }
    */
  }